

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-utf8.cc
# Opt level: O1

void __thiscall utf8_valid_4_bytes_f4_Test::TestBody(utf8_valid_4_bytes_f4_Test *this)

{
  int cu1;
  uint cu1_00;
  int cu2;
  uint cu2_00;
  int cu3;
  uint cu3_00;
  
  cu1_00 = 0;
  do {
    cu2_00 = 0;
    do {
      cu3_00 = 0;
      do {
        anon_unknown.dwarf_103821::assert_is_valid_utf8
                  (((cu2_00 & 0xc0) == 0x80 && (cu1_00 & 0xf0) == 0x80) && (cu3_00 & 0xc0) == 0x80,4
                   ,0xf4,cu1_00,cu2_00,cu3_00);
        cu3_00 = cu3_00 + 1;
      } while (cu3_00 != 0x100);
      cu2_00 = cu2_00 + 1;
    } while (cu2_00 != 0x100);
    cu1_00 = cu1_00 + 1;
  } while (cu1_00 != 0x100);
  return;
}

Assistant:

TEST(utf8, valid_4_bytes_f4) {
  int cu0 = 0xf4;
  FOR_EACH_BYTE(cu1) {
    FOR_EACH_BYTE(cu2) {
      FOR_EACH_BYTE(cu3) {
        bool is_valid = is_in_range(cu1, 0x80, 0x90) &&
                        is_in_range(cu2, 0x80, 0xc0) &&
                        is_in_range(cu3, 0x80, 0xc0);
        assert_is_valid_utf8(is_valid, 4, cu0, cu1, cu2, cu3);
      }
    }
  }
}